

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_link(void)

{
  uv_os_fd_t uVar1;
  int iVar2;
  uv_buf_t uVar3;
  int64_t eval_b_18;
  int64_t eval_a_18;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  size_t local_2f8;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  size_t local_278;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  size_t local_208;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_os_fd_t link;
  uv_os_fd_t file;
  uv_fs_t req;
  int r;
  
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");
  loop = uv_default_loop();
  req.bufsml[3].len._4_4_ =
       uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&link,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  if ((long)req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x821,"r","==","0",(long)req.bufsml[3].len._4_4_,"==",0);
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x822,"req.result",">=","0",req.cb,">=",0);
    abort();
  }
  uVar1 = (uv_os_fd_t)req.cb;
  uv_fs_req_cleanup((uv_fs_t *)&link);
  uVar3 = uv_buf_init(test_buf,0xd);
  eval_a_2 = (int64_t)uVar3.base;
  iov.base = (char *)eval_a_2;
  local_208 = uVar3.len;
  iov.len = local_208;
  req.bufsml[3].len._4_4_ =
       uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)&link,uVar1,&iov,1,-1,(uv_fs_cb)0x0);
  if ((long)req.bufsml[3].len._4_4_ != 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x828,"r","==","sizeof(test_buf)",(long)req.bufsml[3].len._4_4_,"==",0xd);
    abort();
  }
  if (req.cb != (uv_fs_cb)0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x829,"req.result","==","sizeof(test_buf)",req.cb,"==",0xd);
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&link);
  req.bufsml[3].len._4_4_ = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&link,uVar1,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x82e,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x82f,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&link);
  req.bufsml[3].len._4_4_ =
       uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)&link,"test_file","test_file_link",(uv_fs_cb)0x0);
  if ((long)req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x834,"r","==","0",(long)req.bufsml[3].len._4_4_,"==",0);
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x835,"req.result","==","0",req.cb,"==",0);
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&link);
  req.bufsml[3].len._4_4_ =
       uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&link,"test_file_link",2,0,(uv_fs_cb)0x0);
  if ((long)req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x839,"r","==","0",(long)req.bufsml[3].len._4_4_,"==",0);
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x83a,"req.result",">=","0",req.cb,">=",0);
    abort();
  }
  uVar1 = (uv_os_fd_t)req.cb;
  uv_fs_req_cleanup((uv_fs_t *)&link);
  memset(buf,0,0x20);
  uVar3 = uv_buf_init(buf,0x20);
  eval_a_8 = (int64_t)uVar3.base;
  iov.base = (char *)eval_a_8;
  local_278 = uVar3.len;
  iov.len = local_278;
  req.bufsml[3].len._4_4_ =
       uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)&link,uVar1,&iov,1,0,(uv_fs_cb)0x0);
  if ((long)req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x841,"r",">=","0",(long)req.bufsml[3].len._4_4_,">=",0);
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x842,"req.result",">=","0",req.cb,">=",0);
    abort();
  }
  iVar2 = strcmp(buf,test_buf);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x843,"strcmp(buf, test_buf)","==","0",(long)iVar2,"==",0);
    abort();
  }
  req.bufsml[3].len._4_4_ = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&link,uVar1,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x847,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x848,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&link);
  req.bufsml[3].len._4_4_ = uv_fs_link(loop,(uv_fs_t *)&link,"test_file","test_file_link2",link_cb);
  if ((long)req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x84d,"r","==","0",(long)req.bufsml[3].len._4_4_,"==",0);
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if ((long)link_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x84f,"1","==","link_cb_count",1,"==",(long)link_cb_count);
    abort();
  }
  req.bufsml[3].len._4_4_ =
       uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&link,"test_file_link2",2,0,(uv_fs_cb)0x0);
  if ((long)req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x852,"r","==","0",(long)req.bufsml[3].len._4_4_,"==",0);
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x853,"req.result",">=","0",req.cb,">=",0);
    abort();
  }
  uVar1 = (uv_os_fd_t)req.cb;
  uv_fs_req_cleanup((uv_fs_t *)&link);
  memset(buf,0,0x20);
  uVar3 = uv_buf_init(buf,0x20);
  eval_a_15 = (int64_t)uVar3.base;
  iov.base = (char *)eval_a_15;
  local_2f8 = uVar3.len;
  iov.len = local_2f8;
  req.bufsml[3].len._4_4_ =
       uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)&link,uVar1,&iov,1,0,(uv_fs_cb)0x0);
  if ((long)req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x85a,"r",">=","0",(long)req.bufsml[3].len._4_4_,">=",0);
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x85b,"req.result",">=","0",req.cb,">=",0);
    abort();
  }
  iVar2 = strcmp(buf,test_buf);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x85c,"strcmp(buf, test_buf)","==","0",(long)iVar2,"==",0);
    abort();
  }
  req.bufsml[3].len._4_4_ = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&link,uVar1,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x860,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x861,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&link);
  uv_run(loop,UV_RUN_DEFAULT);
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");
  close_loop(loop);
  iVar2 = uv_loop_close(loop);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x86f,"0","==","uv_loop_close(loop)",0,"==",(long)iVar2);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_link) {
  int r;
  uv_fs_t req;
  uv_os_fd_t file;
  uv_os_fd_t link;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", UV_FS_O_RDWR | UV_FS_O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  file = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT_EQ(r, sizeof(test_buf));
  ASSERT_EQ(req.result, sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  /* Close file */
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT_OK(r);
  ASSERT_OK(req.result);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &req, "test_file_link", UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  link = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT_GE(r, 0);
  ASSERT_GE(req.result, 0);
  ASSERT_OK(strcmp(buf, test_buf));

  /* Close link */
  r = uv_fs_close(NULL, &req, link, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async link */
  r = uv_fs_link(loop, &req, "test_file", "test_file_link2", link_cb);
  ASSERT_OK(r);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, link_cb_count);

  r = uv_fs_open(NULL, &req, "test_file_link2", UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  link = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT_GE(r, 0);
  ASSERT_GE(req.result, 0);
  ASSERT_OK(strcmp(buf, test_buf));

  /* Close link */
  r = uv_fs_close(NULL, &req, link, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}